

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~ArrayBuilder
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this)

{
  FieldInfo *pFVar1;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *pRVar2;
  FieldInfo *pFVar3;
  
  pFVar1 = this->ptr;
  if (pFVar1 != (FieldInfo *)0x0) {
    pRVar2 = this->pos;
    pFVar3 = this->endPtr;
    this->ptr = (FieldInfo *)0x0;
    this->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *)0x0;
    this->endPtr = (FieldInfo *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pFVar1,0x38,((long)pRVar2 - (long)pFVar1 >> 3) * 0x6db6db6db6db6db7,
               ((long)pFVar3 - (long)pFVar1 >> 3) * 0x6db6db6db6db6db7,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }